

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printEvent
          (PrettyPrinter *this,ostream *ostr,Event *event,WriterProp *writerProp,
          ClockSync *clockSync)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RDI;
  undefined8 in_R8;
  char spec;
  char c;
  size_t i;
  OstreamBuffer out;
  undefined7 in_stack_fffffffffffffb78;
  char in_stack_fffffffffffffb7f;
  OstreamBuffer *in_stack_fffffffffffffb80;
  undefined8 local_440;
  WriterProp *in_stack_fffffffffffffc30;
  Event *in_stack_fffffffffffffc38;
  char in_stack_fffffffffffffc47;
  OstreamBuffer *in_stack_fffffffffffffc48;
  PrettyPrinter *in_stack_fffffffffffffc50;
  
  detail::OstreamBuffer::OstreamBuffer
            (in_stack_fffffffffffffb80,
             (ostream *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
  *(undefined8 *)(in_RDI + 0x48) = in_R8;
  local_440 = 0;
  do {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_440) {
      detail::OstreamBuffer::~OstreamBuffer((OstreamBuffer *)0x10ee8b);
      return;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    if (*pcVar2 == '%') {
      local_440 = local_440 + 1;
      uVar1 = std::__cxx11::string::size();
      if (local_440 == uVar1) goto LAB_0010ee59;
      in_stack_fffffffffffffb80 = (OstreamBuffer *)std::__cxx11::string::operator[](in_RDI);
      printEventField(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc47,
                      in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    }
    else {
LAB_0010ee59:
      detail::OstreamBuffer::put(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
    }
    local_440 = local_440 + 1;
  } while( true );
}

Assistant:

void PrettyPrinter::printEvent(
  std::ostream& ostr,
  const Event& event,
  const WriterProp& writerProp,
  const ClockSync& clockSync
)
{
  detail::OstreamBuffer out(ostr);
  _clockSync = &clockSync;

  for (std::size_t i = 0; i < _eventFormat.size(); ++i)
  {
    const char c = _eventFormat[i];
    if (c == '%' && ++i != _eventFormat.size())
    {
      const char spec = _eventFormat[i];
      printEventField(out, spec, event, writerProp);
    }
    else
    {
      out.put(c);
    }
  }
}